

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::HardThresholding(Mat *src,Mat *thresholdedCoeffs,float threshold)

{
  bool bVar1;
  float *pfVar2;
  double dVar3;
  int local_5c;
  int x;
  float *p_coeffs;
  int y;
  int cols;
  int rows;
  _OutputArray local_38;
  float local_1c;
  Mat *pMStack_18;
  float threshold_local;
  Mat *thresholdedCoeffs_local;
  Mat *src_local;
  
  local_1c = threshold;
  pMStack_18 = thresholdedCoeffs;
  thresholdedCoeffs_local = src;
  cv::_OutputArray::_OutputArray(&local_38,thresholdedCoeffs);
  cv::Mat::copyTo((_OutputArray *)src);
  cv::_OutputArray::~_OutputArray(&local_38);
  y = *(int *)(pMStack_18 + 8);
  p_coeffs._4_4_ = *(int *)(pMStack_18 + 0xc);
  bVar1 = cv::Mat::isContinuous(pMStack_18);
  if (bVar1) {
    p_coeffs._4_4_ = y * p_coeffs._4_4_;
    y = 1;
  }
  for (p_coeffs._0_4_ = 0; (int)p_coeffs < y; p_coeffs._0_4_ = (int)p_coeffs + 1) {
    pfVar2 = cv::Mat::ptr<float>(pMStack_18,(int)p_coeffs);
    for (local_5c = 0; local_5c < p_coeffs._4_4_; local_5c = local_5c + 1) {
      dVar3 = std::fabs((double)(ulong)(uint)*pfVar2);
      *pfVar2 = (float)(-(uint)(0.0 < SUB84(dVar3,0) - local_1c) & 0x3f800000) * *pfVar2;
    }
  }
  return;
}

Assistant:

void lts2::HardThresholding(const cv::Mat &src, cv::Mat &thresholdedCoeffs, float threshold)
{
  src.copyTo(thresholdedCoeffs);
    
  int rows = thresholdedCoeffs.rows;
  int cols = thresholdedCoeffs.cols;
    
  if (thresholdedCoeffs.isContinuous())
  {
    cols *= rows;
    rows = 1;
  }
    
  for (int y = 0; y < rows; ++y)
  {
    float *p_coeffs = thresholdedCoeffs.ptr<float>(y);
    for (int x = 0; x < cols; ++x) 
      *p_coeffs *= (std::fabs(*p_coeffs) - threshold > 0.0f ? 1.0f: 0.0f);
  }
}